

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meta_pipeline.cpp
# Opt level: O0

Pipeline * __thiscall
duckdb::MetaPipeline::CreateUnionPipeline(MetaPipeline *this,Pipeline *current,bool order_matters)

{
  bool bVar1;
  Pipeline *__uref;
  vector<std::reference_wrapper<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
  *this_00;
  byte in_DL;
  long in_RDI;
  iterator it;
  Pipeline *union_pipeline;
  Pipeline *in_stack_ffffffffffffff38;
  Pipeline *in_stack_ffffffffffffff40;
  Pipeline *in_stack_ffffffffffffff48;
  PipelineBuildState *in_stack_ffffffffffffff50;
  MetaPipeline *in_stack_ffffffffffffff80;
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_true>
  local_68 [2];
  _Node_iterator_base<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_true>
  local_58;
  PhysicalOperator *local_50;
  Pipeline *local_20;
  byte local_11;
  
  local_11 = in_DL & 1;
  local_20 = CreatePipeline(in_stack_ffffffffffffff80);
  PipelineBuildState::GetPipelineOperators
            ((PipelineBuildState *)in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
  PipelineBuildState::SetPipelineOperators
            (in_stack_ffffffffffffff50,in_stack_ffffffffffffff48,
             (vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
             in_stack_ffffffffffffff40);
  vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::~vector
            ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)0x98fe67);
  local_50 = *(PhysicalOperator **)(in_RDI + 0x28);
  PipelineBuildState::SetPipelineSink
            (*(PipelineBuildState **)(in_RDI + 0x18),local_20,
             (optional_ptr<duckdb::PhysicalOperator,_true>)local_50,0);
  vector<duckdb::weak_ptr<duckdb::Pipeline,_true>,_true>::operator=
            ((vector<duckdb::weak_ptr<duckdb::Pipeline,_true>,_true> *)in_stack_ffffffffffffff40,
             (vector<duckdb::weak_ptr<duckdb::Pipeline,_true>,_true> *)in_stack_ffffffffffffff38);
  ::std::reference_wrapper<duckdb::Pipeline>::
  reference_wrapper<duckdb::Pipeline&,void,duckdb::Pipeline*>
            ((reference_wrapper<duckdb::Pipeline> *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff38);
  local_58._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
       ::find((unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
               *)in_stack_ffffffffffffff38,(key_type *)0x98fedb);
  local_68[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
       ::end((unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
              *)in_stack_ffffffffffffff38);
  bVar1 = ::std::__detail::operator!=(&local_58,local_68);
  if (bVar1) {
    ::std::__detail::
    _Node_iterator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_false,_true>
    ::operator->((_Node_iterator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>,_false,_true>
                  *)0x98ff12);
    ::std::reference_wrapper<duckdb::Pipeline>::
    reference_wrapper<duckdb::Pipeline&,void,duckdb::Pipeline*>
              ((reference_wrapper<duckdb::Pipeline> *)in_stack_ffffffffffffff40,
               in_stack_ffffffffffffff38);
    ::std::
    unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
    ::operator[]((unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
                  *)in_stack_ffffffffffffff40,(key_type *)in_stack_ffffffffffffff38);
    vector<std::reference_wrapper<duckdb::Pipeline>,_true>::operator=
              ((vector<std::reference_wrapper<duckdb::Pipeline>,_true> *)in_stack_ffffffffffffff40,
               (vector<std::reference_wrapper<duckdb::Pipeline>,_true> *)in_stack_ffffffffffffff38);
  }
  if ((local_11 & 1) != 0) {
    __uref = (Pipeline *)(in_RDI + 0x50);
    ::std::reference_wrapper<duckdb::Pipeline>::
    reference_wrapper<duckdb::Pipeline&,void,duckdb::Pipeline*>
              ((reference_wrapper<duckdb::Pipeline> *)in_stack_ffffffffffffff40,__uref);
    this_00 = &::std::
               unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
               ::operator[]((unordered_map<std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>,_duckdb::ReferenceHashFunction<duckdb::Pipeline>,_duckdb::ReferenceEquality<duckdb::Pipeline>,_std::allocator<std::pair<const_std::reference_wrapper<duckdb::Pipeline>,_duckdb::vector<std::reference_wrapper<duckdb::Pipeline>,_true>_>_>_>
                             *)in_stack_ffffffffffffff40,(key_type *)__uref)->
               super_vector<std::reference_wrapper<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
    ;
    ::std::reference_wrapper<duckdb::Pipeline>::
    reference_wrapper<duckdb::Pipeline&,void,duckdb::Pipeline*>
              ((reference_wrapper<duckdb::Pipeline> *)this_00,__uref);
    ::std::
    vector<std::reference_wrapper<duckdb::Pipeline>,_std::allocator<std::reference_wrapper<duckdb::Pipeline>_>_>
    ::push_back(this_00,(value_type *)__uref);
  }
  return local_20;
}

Assistant:

Pipeline &MetaPipeline::CreateUnionPipeline(Pipeline &current, bool order_matters) {
	// create the union pipeline (batch index 0, should be set correctly afterwards)
	auto &union_pipeline = CreatePipeline();
	state.SetPipelineOperators(union_pipeline, state.GetPipelineOperators(current));
	state.SetPipelineSink(union_pipeline, sink, 0);

	// 'union_pipeline' inherits ALL dependencies of 'current' (within this MetaPipeline, and across MetaPipelines)
	union_pipeline.dependencies = current.dependencies;
	auto it = pipeline_dependencies.find(current);
	if (it != pipeline_dependencies.end()) {
		pipeline_dependencies[union_pipeline] = it->second;
	}

	if (order_matters) {
		// if we need to preserve order, or if the sink is not parallel, we set a dependency
		pipeline_dependencies[union_pipeline].push_back(current);
	}

	return union_pipeline;
}